

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

void Nwk_ManGraphSortPairs(Nwk_Grf_t *p)

{
  int iVar1;
  int Entry;
  Vec_Int_t *pVVar2;
  void *__ptr;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  pVVar2 = p->vPairs;
  iVar1 = pVVar2->nSize;
  iVar5 = p->nObjs;
  __ptr = malloc((long)iVar5 * 4 + 4);
  for (lVar3 = 0; lVar3 <= iVar5; lVar3 = lVar3 + 1) {
    *(undefined4 *)((long)__ptr + lVar3 * 4) = 0xffffffff;
  }
  lVar3 = 0;
  while( true ) {
    if (iVar1 <= lVar3) {
      pVVar2->nSize = 0;
      uVar6 = 0;
      do {
        if ((long)iVar5 < (long)uVar6) {
          if (iVar1 == p->vPairs->nSize) {
            free(__ptr);
            return;
          }
          __assert_fail("nSize == Vec_IntSize(p->vPairs)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                        ,0x182,"void Nwk_ManGraphSortPairs(Nwk_Grf_t *)");
        }
        Entry = *(int *)((long)__ptr + uVar6 * 4);
        if (-1 < (long)Entry) {
          if ((ulong)(long)Entry <= uVar6) {
            __assert_fail("i < pIdToPair[i]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                          ,0x17e,"void Nwk_ManGraphSortPairs(Nwk_Grf_t *)");
          }
          Vec_IntPush(p->vPairs,(int)uVar6);
          Vec_IntPush(p->vPairs,Entry);
          iVar5 = p->nObjs;
        }
        uVar6 = uVar6 + 1;
      } while( true );
    }
    lVar4 = (long)pVVar2->pArray[lVar3];
    if (*(int *)((long)__ptr + lVar4 * 4) != -1) break;
    *(int *)((long)__ptr + lVar4 * 4) = pVVar2->pArray[lVar3 + 1];
    lVar3 = lVar3 + 2;
  }
  __assert_fail("pIdToPair[ p->vPairs->pArray[i] ] == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                ,0x176,"void Nwk_ManGraphSortPairs(Nwk_Grf_t *)");
}

Assistant:

void Nwk_ManGraphSortPairs( Nwk_Grf_t * p )
{
    int nSize = Vec_IntSize(p->vPairs);
    int * pIdToPair, i;
    // allocate storage
    pIdToPair = ABC_ALLOC( int, p->nObjs+1 );
    for ( i = 0; i <= p->nObjs; i++ )
        pIdToPair[i] = -1;
    // create mapping
    for ( i = 0; i < p->vPairs->nSize; i += 2 )
    {
        assert( pIdToPair[ p->vPairs->pArray[i] ] == -1 );
        pIdToPair[ p->vPairs->pArray[i] ] = p->vPairs->pArray[i+1];
    }
    // recreate pairs
    Vec_IntClear( p->vPairs );
    for ( i = 0; i <= p->nObjs; i++ )
        if ( pIdToPair[i] >= 0 )
        {
            assert( i < pIdToPair[i] );
            Vec_IntPush( p->vPairs, i );
            Vec_IntPush( p->vPairs, pIdToPair[i] );
        }
    assert( nSize == Vec_IntSize(p->vPairs) );
    ABC_FREE( pIdToPair );
}